

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

char * Scl_LibertyReadCellArea(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *pcVar3;
  int *piVar4;
  
  piVar4 = &pCell->Child;
  while( true ) {
    pSVar2 = Scl_LibertyItem(p,*piVar4);
    if (pSVar2 == (Scl_Item_t *)0x0) {
      return (char *)0x0;
    }
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"area");
    if (iVar1 == 0) break;
    piVar4 = &pSVar2->Next;
  }
  pcVar3 = Scl_LibertyReadString(p,pSVar2->Head);
  return pcVar3;
}

Assistant:

char * Scl_LibertyReadCellArea( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pArea;
    Scl_ItemForEachChildName( p, pCell, pArea, "area" )
        return Scl_LibertyReadString(p, pArea->Head);
    return 0;
}